

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void dynamic_suite::test_array(void)

{
  undefined1 *this;
  bool v;
  char *pcVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_378;
  iterator local_360;
  iterator local_348;
  iterator local_330;
  iterator local_318;
  basic_variable<std::allocator<char>_> *local_300;
  basic_variable<std::allocator<char>_> local_2f8;
  basic_variable<std::allocator<char>_> local_2c8;
  basic_variable<std::allocator<char>_> local_298;
  basic_variable<std::allocator<char>_> local_268;
  undefined1 local_238 [24];
  variable expect;
  char *msg;
  undefined1 local_1d8 [8];
  variable value;
  undefined1 local_198 [8];
  iarchive in;
  char input [24];
  
  in.member.reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x32202c657572745b;
  this = &value.storage.field_0x28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,
             (char *)((long)&in.member.reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl + 0x10));
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            ((basic_iarchive<char> *)local_198,(view_type *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  boost::archive::detail::interface_iarchive<trial::protocol::json::basic_iarchive<char>>::
  operator>>((interface_iarchive<trial::protocol::json::basic_iarchive<char>> *)local_198,
             (basic_variable<std::allocator<char>_> *)local_1d8);
  v = trial::dynamic::basic_variable<std::allocator<char>>::
      is<trial::dynamic::basic_array<std::allocator<char>>>
                ((basic_variable<std::allocator<char>> *)local_1d8);
  pcVar1 = "void dynamic_suite::test_array()";
  boost::detail::test_impl
            ("value.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2dc,"void dynamic_suite::test_array()",v);
  local_300 = &local_2f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_300,true);
  local_300 = &local_2c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_300,2);
  local_300 = &local_298;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_300,3.0);
  local_300 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_300,"alpha");
  local_238._0_8_ = &local_2f8;
  local_238._8_8_ = 4;
  init._M_len = (size_type)pcVar1;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_238 + 0x10),
             (basic_array<std::allocator<char>_> *)local_238._0_8_,init);
  local_378 = (basic_variable<std::allocator<char>_> *)local_238;
  do {
    local_378 = local_378 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_378);
  } while (local_378 != &local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_318,(basic_variable<std::allocator<char>_> *)local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_330,(basic_variable<std::allocator<char>_> *)local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_348,(basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_360,(basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2e0,"void dynamic_suite::test_array()",&local_318,&local_330,&local_348,&local_360);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_360);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_330);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive((basic_iarchive<char> *)local_198);
  return;
}

Assistant:

void test_array()
{
    const char input[] = "[true, 2, 3.0, \"alpha\"]";
    json::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value.is<array>());
    variable expect = array::make({ true, 2, 3.0, "alpha" });
    TRIAL_PROTOCOL_TEST_ALL_WITH(value.begin(), value.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}